

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O2

void Abc_NodeLeavesRemove(Vec_Ptr_t *vLeaves,uint uPhase,int nVars)

{
  uint uVar1;
  long lVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  
  do {
    do {
      if (nVars < 1) {
        return;
      }
      nVars = nVars - 1;
    } while ((uPhase >> (nVars & 0x1fU) & 1) == 0);
    pvVar3 = Vec_PtrEntry(vLeaves,nVars);
    uVar1 = vLeaves->nSize;
    uVar4 = (ulong)uVar1;
    do {
      if ((int)uVar4 < 1) {
        __assert_fail("i >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
      }
      uVar5 = uVar4 - 1;
      lVar2 = uVar4 - 1;
      uVar4 = uVar5;
    } while (vLeaves->pArray[lVar2] != pvVar3);
    while (uVar4 = uVar5 + 1, (int)uVar4 < (int)uVar1) {
      vLeaves->pArray[uVar5] = vLeaves->pArray[uVar4];
      uVar5 = uVar4;
    }
    vLeaves->nSize = uVar1 - 1;
  } while( true );
}

Assistant:

void Abc_NodeLeavesRemove( Vec_Ptr_t * vLeaves, unsigned uPhase, int nVars )
{
    int i;
    for ( i = nVars - 1; i >= 0; i-- )
        if ( uPhase & (1 << i) )
            Vec_PtrRemove( vLeaves, Vec_PtrEntry(vLeaves, i) );
}